

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__is_16_main(stbi__context *s)

{
  stbi_uc sVar1;
  stbi_uc sVar2;
  int iVar3;
  stbi__uint32 sVar4;
  stbi_uc *psVar5;
  stbi__png p;
  stbi__png local_38;
  
  local_38.s = s;
  iVar3 = stbi__parse_png_file(&local_38,2,0);
  if ((iVar3 != 0) && (local_38.depth == 0x10)) {
    return 1;
  }
  (local_38.s)->img_buffer = (local_38.s)->img_buffer_original;
  (local_38.s)->img_buffer_end = (local_38.s)->img_buffer_original_end;
  sVar4 = stbi__get32be(s);
  if (sVar4 != 0x38425053) goto LAB_0016e14d;
  sVar1 = stbi__get8(s);
  sVar2 = stbi__get8(s);
  if (CONCAT11(sVar1,sVar2) != 1) goto LAB_0016e14d;
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
    psVar5 = s->img_buffer;
LAB_0016e0ed:
    s->img_buffer = psVar5 + 6;
  }
  else {
    psVar5 = s->img_buffer;
    iVar3 = (int)s->img_buffer_end - (int)psVar5;
    if (5 < iVar3) goto LAB_0016e0ed;
    s->img_buffer = s->img_buffer_end;
    (*(s->io).skip)(s->io_user_data,6 - iVar3);
  }
  sVar1 = stbi__get8(s);
  sVar2 = stbi__get8(s);
  if (CONCAT11(sVar1,sVar2) < 0x11) {
    stbi__get32be(s);
    stbi__get32be(s);
    sVar1 = stbi__get8(s);
    sVar2 = stbi__get8(s);
    if (CONCAT11(sVar1,sVar2) == 0x10) {
      return 1;
    }
  }
LAB_0016e14d:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return 0;
}

Assistant:

static int stbi__is_16_main(stbi__context *s)
{
   #ifndef STBI_NO_PNG
   if (stbi__png_is16(s))  return 1;
   #endif

   #ifndef STBI_NO_PSD
   if (stbi__psd_is16(s))  return 1;
   #endif

   return 0;
}